

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsInfo.cpp
# Opt level: O2

InfoStatus
getLocalInfoValue(HighsLogOptions *report_log_options,string *name,bool valid,
                 vector<InfoRecord_*,_std::allocator<InfoRecord_*>_> *info_records,double *value)

{
  HighsInfoType type;
  InfoRecordDouble *pIVar1;
  pointer pcVar2;
  InfoStatus IVar3;
  InfoStatus IVar4;
  HighsInt index;
  InfoRecordDouble info;
  
  IVar3 = getInfoIndex(report_log_options,name,info_records,&index);
  IVar4 = kUnavailable;
  if (IVar3 != kOk) {
    IVar4 = IVar3;
  }
  if (IVar3 == kOk && valid) {
    pIVar1 = (InfoRecordDouble *)
             (info_records->super__Vector_base<InfoRecord_*,_std::allocator<InfoRecord_*>_>)._M_impl
             .super__Vector_impl_data._M_start[index];
    type = (pIVar1->super_InfoRecord).type;
    if (type == kDouble) {
      InfoRecordDouble::InfoRecordDouble(&info,pIVar1);
      *value = *info.value;
      InfoRecord::~InfoRecord(&info.super_InfoRecord);
      IVar4 = kOk;
    }
    else {
      pcVar2 = (name->_M_dataplus)._M_p;
      infoEntryTypeToString_abi_cxx11_((string *)&info,type);
      highsLogUser(report_log_options,kError,
                   "getInfoValue: Info \"%s\" requires value of type %s, not double\n",pcVar2,
                   info.super_InfoRecord._vptr_InfoRecord);
      std::__cxx11::string::~string((string *)&info);
      IVar4 = kIllegalValue;
    }
  }
  return IVar4;
}

Assistant:

InfoStatus getLocalInfoValue(const HighsLogOptions& report_log_options,
                             const std::string& name, const bool valid,
                             const std::vector<InfoRecord*>& info_records,
                             double& value) {
  HighsInt index;
  InfoStatus status =
      getInfoIndex(report_log_options, name, info_records, index);
  if (status != InfoStatus::kOk) return status;
  if (!valid) return InfoStatus::kUnavailable;
  HighsInfoType type = info_records[index]->type;
  if (type != HighsInfoType::kDouble) {
    highsLogUser(
        report_log_options, HighsLogType::kError,
        "getInfoValue: Info \"%s\" requires value of type %s, not double\n",
        name.c_str(), infoEntryTypeToString(type).c_str());
    return InfoStatus::kIllegalValue;
  }
  InfoRecordDouble info = ((InfoRecordDouble*)info_records[index])[0];
  value = *info.value;
  return InfoStatus::kOk;
}